

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O2

void test_iterate(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  size_t sVar2;
  undefined8 uStack_30;
  size_t local_20;
  
  bitset = bitset_create();
  for (sVar2 = 0; sVar2 != 3000; sVar2 = sVar2 + 3) {
    bitset_set(bitset,sVar2);
  }
  sVar2 = bitset_count(bitset);
  if (sVar2 == 1000) {
    local_20 = 0;
    sVar2 = 0;
    while( true ) {
      _Var1 = bitset_next_set_bit(bitset,&local_20);
      if (!_Var1) break;
      if (sVar2 != local_20) {
        uStack_30 = 0x15;
        goto LAB_00101280;
      }
      local_20 = sVar2 + 1;
      sVar2 = sVar2 + 3;
    }
    if (sVar2 == 3000) {
      bitset_free(bitset);
      return;
    }
    uStack_30 = 0x18;
  }
  else {
    uStack_30 = 0x12;
  }
LAB_00101280:
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_iterate",uStack_30);
  exit(1);
}

Assistant:

void test_iterate() {
  bitset_t *b = bitset_create();
  for (int k = 0; k < 1000; ++k)
    bitset_set(b, 3 * k);
  TEST_ASSERT(bitset_count(b) == 1000);
  size_t k = 0;
  for (size_t i = 0; bitset_next_set_bit(b, &i); i++) {
    TEST_ASSERT(i == k);
    k += 3;
  }
  TEST_ASSERT(k == 3000);
  bitset_free(b);
}